

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O1

QStringList * __thiscall
QDeviceDiscoveryUDev::scanConnectedDevices
          (QStringList *__return_storage_ptr__,QDeviceDiscoveryUDev *this)

{
  int *piVar1;
  QDebug this_00;
  char cVar2;
  int iVar3;
  Stream *__old_val;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  storage_type *psVar9;
  storage_type *psVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QByteArrayView QVar14;
  QString local_88;
  char *local_70;
  QDebug local_68;
  QDebug local_60;
  QtPrivate local_58 [8];
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(this + 0x18) != 0) {
    uVar4 = udev_enumerate_new();
    udev_enumerate_add_match_subsystem(uVar4,"input");
    udev_enumerate_add_match_subsystem(uVar4,"drm");
    if (((byte)this[0x10] & 1) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_MOUSE","1");
    }
    if (((byte)this[0x10] & 2) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_TOUCHPAD","1");
    }
    if (((byte)this[0x10] & 4) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_TOUCHSCREEN","1");
    }
    if (((byte)this[0x10] & 8) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_KEYBOARD","1");
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_KEY","1");
    }
    if (((byte)this[0x10] & 0x40) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_TABLET","1");
    }
    if (((byte)this[0x10] & 0x80) != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_JOYSTICK","1");
    }
    iVar3 = udev_enumerate_scan_devices(uVar4);
    if (iVar3 == 0) {
      lVar5 = udev_enumerate_get_list_entry(uVar4);
      if (lVar5 != 0) {
        do {
          udev_list_entry_get_name(lVar5);
          uVar6 = udev_device_new_from_syspath(*(undefined8 *)(this + 0x18));
          local_88.d.size._0_4_ = 0xaaaaaaaa;
          local_88.d.size._4_4_ = 0xaaaaaaaa;
          local_88.d.d._0_4_ = 0xaaaaaaaa;
          local_88.d.d._4_4_ = 0xaaaaaaaa;
          local_88.d.ptr._0_4_ = 0xaaaaaaaa;
          local_88.d.ptr._4_4_ = 0xaaaaaaaa;
          lVar7 = udev_device_get_devnode(uVar6);
          if (lVar7 == 0) {
            psVar10 = (storage_type *)0x0;
          }
          else {
            psVar9 = (storage_type *)0xffffffffffffffff;
            do {
              psVar10 = psVar9 + 1;
              pcVar8 = psVar9 + lVar7 + 1;
              psVar9 = psVar10;
            } while (*pcVar8 != '\0');
          }
          QVar11.m_data = psVar10;
          QVar11.m_size = (qsizetype)&local_88;
          QString::fromUtf8(QVar11);
          if ((((byte)this[0x10] & 0xcf) != 0) &&
             (QVar12.m_data = (char *)0x10, QVar12.m_size = (qsizetype)&local_88,
             cVar2 = QString::startsWith(QVar12,0x10db5b), cVar2 != '\0')) {
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,&local_88);
            QList<QString>::end(__return_storage_ptr__);
          }
          if ((((byte)this[0x10] & 0x10) != 0) &&
             (QVar13.m_data = (char *)0xd, QVar13.m_size = (qsizetype)&local_88,
             cVar2 = QString::startsWith(QVar13,0x10db6c), cVar2 != '\0')) {
            if (((byte)this[0x10] & 0x20) == 0) {
LAB_001097b9:
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,&local_88);
              QList<QString>::end(__return_storage_ptr__);
            }
            else {
              lVar7 = udev_device_get_parent_with_subsystem_devtype(uVar6,"pci",0);
              if (lVar7 != 0) {
                pcVar8 = (char *)udev_device_get_sysattr_value(lVar7,"boot_vga");
                iVar3 = qstrcmp(pcVar8,"1");
                if (iVar3 == 0) goto LAB_001097b9;
              }
            }
          }
          udev_device_unref(uVar6);
          piVar1 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
            }
          }
          lVar5 = udev_list_entry_get_next(lVar5);
        } while (lVar5 != 0);
      }
      udev_enumerate_unref(uVar4);
      lcDD();
      if (((byte)lcDD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_88.d.d._0_4_ = 2;
        local_88.d.d._4_4_ = 0;
        local_88.d.ptr._0_4_ = 0;
        local_88.d.ptr._4_4_ = 0;
        local_88.d.size._0_4_ = 0;
        local_88.d.size._4_4_ = 0;
        local_70 = lcDD::category.name;
        QMessageLogger::debug();
        this_00.stream = local_68.stream;
        QVar14.m_data = (storage_type *)0x16;
        QVar14.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar14);
        QTextStream::operator<<((QTextStream *)this_00.stream,&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)(((QArrayData *)(local_68.stream + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_68.stream,' ');
        }
        *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
        local_60.stream = (Stream *)0x0;
        local_50.d.d = (Data *)local_68.stream;
        QtPrivate::printSequentialContainer<QList<QString>>
                  (local_58,(Stream *)&local_50,"QList",__return_storage_ptr__);
        QDebug::~QDebug((QDebug *)&local_50);
        QDebug::~QDebug((QDebug *)local_58);
        QDebug::~QDebug(&local_60);
        QDebug::~QDebug(&local_68);
      }
    }
    else {
      scanConnectedDevices();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QDeviceDiscoveryUDev::scanConnectedDevices()
{
    QStringList devices;

    if (!m_udev)
        return devices;

    udev_enumerate *ue = udev_enumerate_new(m_udev);
    udev_enumerate_add_match_subsystem(ue, "input");
    udev_enumerate_add_match_subsystem(ue, "drm");

    if (m_types & Device_Mouse)
        udev_enumerate_add_match_property(ue, "ID_INPUT_MOUSE", "1");
    if (m_types & Device_Touchpad)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TOUCHPAD", "1");
    if (m_types & Device_Touchscreen)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TOUCHSCREEN", "1");
    if (m_types & Device_Keyboard) {
        udev_enumerate_add_match_property(ue, "ID_INPUT_KEYBOARD", "1");
        udev_enumerate_add_match_property(ue, "ID_INPUT_KEY", "1");
    }
    if (m_types & Device_Tablet)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TABLET", "1");
    if (m_types & Device_Joystick)
        udev_enumerate_add_match_property(ue, "ID_INPUT_JOYSTICK", "1");

    if (udev_enumerate_scan_devices(ue) != 0) {
        qWarning("Failed to scan devices");
        return devices;
    }

    udev_list_entry *entry;
    udev_list_entry_foreach (entry, udev_enumerate_get_list_entry(ue)) {
        const char *syspath = udev_list_entry_get_name(entry);
        udev_device *udevice = udev_device_new_from_syspath(m_udev, syspath);
        QString candidate = QString::fromUtf8(udev_device_get_devnode(udevice));
        if ((m_types & Device_InputMask) && candidate.startsWith(QT_EVDEV_DEVICE ""_L1))
            devices << candidate;
        if ((m_types & Device_VideoMask) && candidate.startsWith(QT_DRM_DEVICE ""_L1)) {
            if (m_types & Device_DRM_PrimaryGPU) {
                udev_device *pci = udev_device_get_parent_with_subsystem_devtype(udevice, "pci", 0);
                if (pci) {
                    if (qstrcmp(udev_device_get_sysattr_value(pci, "boot_vga"), "1") == 0)
                        devices << candidate;
                }
            } else
                devices << candidate;
        }

        udev_device_unref(udevice);
    }
    udev_enumerate_unref(ue);

    qCDebug(lcDD) << "Found matching devices" << devices;

    return devices;
}